

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open_cl_kernels.cxx
# Opt level: O3

bool __thiscall
OpenCLKernels::runKernelUpdateFlickerCounter
          (OpenCLKernels *this,UMat *adjacent_frames_similarity_sum,uint similarity_max,
          UMat *corresponding_frames_similarity_sum,float threshold,UMat *flicker_counter,
          string *error)

{
  mutex *__mutex;
  char cVar1;
  int iVar2;
  uint uVar3;
  undefined8 uVar4;
  size_t global_size [2];
  size_t local_size [2];
  float local_d8;
  uint local_d4;
  Queue local_d0 [8];
  ulong local_c8;
  long local_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  KernelArg local_a8 [40];
  KernelArg local_80 [40];
  KernelArg local_58 [40];
  
  local_d8 = threshold;
  local_d4 = similarity_max;
  if (this->opencl_available == false) {
    std::__cxx11::string::_M_assign((string *)error);
    cVar1 = '\0';
  }
  else {
    local_c8 = (ulong)*(int *)(adjacent_frames_similarity_sum + 0xc);
    local_c0 = (long)*(int *)(adjacent_frames_similarity_sum + 8);
    local_b8 = 0x10;
    uStack_b0 = 0x10;
    __mutex = &this->kernel_update_flicker_counter_guard;
    iVar2 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
    if (iVar2 != 0) {
      uVar4 = std::__throw_system_error(iVar2);
      cv::ocl::Queue::~Queue(local_d0);
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      _Unwind_Resume(uVar4);
    }
    cv::ocl::KernelArg::KernelArg(local_58,0x102,adjacent_frames_similarity_sum,1,1,(void *)0x0,0);
    cv::ocl::KernelArg::KernelArg
              (local_80,0x102,corresponding_frames_similarity_sum,1,1,(void *)0x0,0);
    cv::ocl::KernelArg::KernelArg(local_a8,0x106,flicker_counter,1,1,(void *)0x0,0);
    iVar2 = (int)this + 0x30;
    uVar3 = cv::ocl::Kernel::set(iVar2,(KernelArg *)0x0);
    uVar3 = cv::ocl::Kernel::set(iVar2,(void *)(ulong)uVar3,(ulong)&local_d4);
    uVar3 = cv::ocl::Kernel::set(iVar2,(KernelArg *)(ulong)uVar3);
    uVar3 = cv::ocl::Kernel::set(iVar2,(void *)(ulong)uVar3,(ulong)&local_d8);
    cv::ocl::Kernel::set(iVar2,(KernelArg *)(ulong)uVar3);
    cv::ocl::Queue::Queue(local_d0);
    cVar1 = cv::ocl::Kernel::run(iVar2,(ulong *)0x2,&local_c8,SUB81(&local_b8,0),(Queue *)0x1);
    cv::ocl::Queue::~Queue(local_d0);
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    if (cVar1 == '\0') {
      std::__cxx11::string::_M_replace((ulong)error,0,(char *)error->_M_string_length,0x11a328);
    }
  }
  return (bool)cVar1;
}

Assistant:

bool OpenCLKernels::runKernelUpdateFlickerCounter(const UMat &adjacent_frames_similarity_sum,
                                                  unsigned int similarity_max,
                                                  const UMat &corresponding_frames_similarity_sum, float threshold,
                                                  UMat &flicker_counter, std::string &error)
{
    if(!isAvailable(error)) {
        return false;
    }

    size_t global_size[2] = {(size_t) adjacent_frames_similarity_sum.cols,
                             (size_t) adjacent_frames_similarity_sum.rows};
    size_t local_size[2] = {16, 16};
    bool execution_result;
    {
        scoped_lock<mutex> lock(kernel_update_flicker_counter_guard);
        execution_result = kernel_update_flicker_counter.args(
                        cv::ocl::KernelArg::ReadOnlyNoSize(adjacent_frames_similarity_sum),
                        similarity_max,
                        cv::ocl::KernelArg::ReadOnlyNoSize(corresponding_frames_similarity_sum),
                        threshold,
                        cv::ocl::KernelArg::ReadWriteNoSize(flicker_counter)
                ).run(2, global_size, local_size, true);
    }
    if(!execution_result) {
        error = "OpenCL kernel: kernel_update_flicker_counter launch failed.";
        return false;
    }

    return true;
}